

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O0

ParserResult *
parse_command_statement
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  size_t *this;
  bool bVar1;
  SyntaxTree *this_00;
  element_type *this_01;
  shared_ptr<SyntaxTree> *psVar2;
  shared_ptr<SyntaxTree> local_278;
  ParserSuccess local_268;
  pair<const_TokenStream::TokenData_*,_ParserSuccess> local_258;
  shared_ptr<SyntaxTree> local_240;
  undefined1 local_230 [8];
  shared_ptr<SyntaxTree> tree;
  ParserState local_1c8;
  tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
  local_170 [16];
  ParserResult local_160;
  undefined1 local_f0 [8];
  TokenData *it;
  ParserState positive_command;
  undefined1 local_80 [8];
  ParserState state;
  token_iterator end_local;
  token_iterator begin_local;
  ParserContext *parser_local;
  
  state._storage.
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
  .
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
  ._which = (size_t)end;
  if ((begin == end) || (begin->type != NOT)) {
    parse_positive_command_statement(__return_storage_ptr__,parser,begin,end);
  }
  else {
    this = &positive_command._storage.
            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
            .
            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
            ._which;
    ParserSuccess::ParserSuccess((ParserSuccess *)this,(nullptr_t)0x0);
    eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>::
    variant<ParserSuccess,0ul,ParserSuccess>
              ((variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>> *)local_80,
               (ParserSuccess *)this);
    ParserSuccess::~ParserSuccess((ParserSuccess *)this);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)&it);
    local_f0 = (undefined1  [8])std::next<TokenStream::TokenData_const*>(begin,1);
    parse_positive_command_statement
              (&local_160,parser,(token_iterator)local_f0,
               (token_iterator)
               state._storage.
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               .
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               ._which);
    std::
    tie<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
              ((TokenData **)local_170,
               (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_f0);
    std::
    tuple<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>&>
    ::operator=(local_170,&local_160);
    std::
    pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
    ::~pair(&local_160);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
               &tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)&it);
    giveup_to_expected(&local_1c8,
                       (ParserState *)
                       &tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       "command");
    add_error((ParserState *)local_80,&local_1c8);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              (&local_1c8);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
               &tree.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar1 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                      ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                       local_80);
    if (bVar1) {
      this_00 = (SyntaxTree *)operator_new(0x88);
      SyntaxTree::SyntaxTree(this_00,NOT,&parser->instream,begin);
      std::shared_ptr<SyntaxTree>::shared_ptr<SyntaxTree,void>
                ((shared_ptr<SyntaxTree> *)local_230,this_00);
      this_01 = std::__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_230);
      psVar2 = &eggs::variants::
                get<ParserSuccess,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>,0ul>
                          ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)
                           &it)->tree;
      std::shared_ptr<SyntaxTree>::shared_ptr(&local_240,psVar2);
      SyntaxTree::add_child(this_01,&local_240);
      std::shared_ptr<SyntaxTree>::~shared_ptr(&local_240);
      std::shared_ptr<SyntaxTree>::shared_ptr(&local_278,(shared_ptr<SyntaxTree> *)local_230);
      ParserSuccess::ParserSuccess(&local_268,&local_278);
      std::make_pair<TokenStream::TokenData_const*&,ParserSuccess>
                (&local_258,(TokenData **)local_f0,&local_268);
      std::
      pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
      ::pair<const_TokenStream::TokenData_*,_ParserSuccess,_true>(__return_storage_ptr__,&local_258)
      ;
      std::pair<const_TokenStream::TokenData_*,_ParserSuccess>::~pair(&local_258);
      ParserSuccess::~ParserSuccess(&local_268);
      std::shared_ptr<SyntaxTree>::~shared_ptr(&local_278);
      std::shared_ptr<SyntaxTree>::~shared_ptr((shared_ptr<SyntaxTree> *)local_230);
    }
    else {
      std::
      make_pair<TokenStream::TokenData_const*&,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                (__return_storage_ptr__,(TokenData **)local_f0,
                 (variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_80);
    }
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)&it);
    eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>::~variant
              ((variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

static ParserResult parse_command_statement(ParserContext& parser, token_iterator begin, token_iterator end)
{
    if(begin != end && begin->type == Token::NOT)
    {
        ParserState state = ParserSuccess(nullptr);
        ParserState positive_command;

        auto it = std::next(begin);

        std::tie(it, positive_command) = parse_positive_command_statement(parser, it, end);
        add_error(state, giveup_to_expected(positive_command, "command"));

        if(is<ParserSuccess>(state))
        {
            shared_ptr<SyntaxTree> tree(new SyntaxTree(NodeType::NOT, parser.instream, *begin));
            tree->add_child(get<ParserSuccess>(positive_command).tree);
            return std::make_pair(it, ParserSuccess(std::move(tree)));
        }
        else
        {
            return std::make_pair(it, std::move(state));
        }
    }
    else
    {
        return parse_positive_command_statement(parser, begin, end);
    }
}